

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

uint __thiscall Js::FunctionBody::GetLoopInterpretCount(FunctionBody *this,LoopHeader *loopHeader)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  uint uVar4;
  undefined4 *puVar5;
  LoopHeader *loopHeader_local;
  FunctionBody *this_local;
  
  if ((loopHeader->isNested & 1U) == 0) {
    this_local._4_4_ = GetLoopInterpreterLimit(this);
  }
  else {
    uVar3 = GetLoopInterpreterLimit(this);
    uVar4 = GetReducedLoopInterpretCount();
    if (uVar3 < uVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1ca4,
                                  "(GetLoopInterpreterLimit() >= GetReducedLoopInterpretCount())",
                                  "GetLoopInterpreterLimit() >= GetReducedLoopInterpretCount()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    this_local._4_4_ = GetReducedLoopInterpretCount();
  }
  return this_local._4_4_;
}

Assistant:

uint FunctionBody::GetLoopInterpretCount(LoopHeader* loopHeader) const
    {
        if(loopHeader->isNested)
        {
            Assert(GetLoopInterpreterLimit() >= GetReducedLoopInterpretCount());
            return GetReducedLoopInterpretCount();
        }
        return GetLoopInterpreterLimit();
    }